

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmsh_file_v4.cc
# Opt level: O0

GMshFileV4 *
lf::io::ReadGmshFileV4
          (GMshFileV4 *__return_storage_ptr__,const_iterator begin,const_iterator end,
          string *version,bool is_binary,int size_t_size,int one,string *filename)

{
  bool bVar1;
  runtime_error *prVar2;
  ostream *poVar3;
  reference pPVar4;
  DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *this;
  PeriodicLink *p;
  iterator __end2;
  iterator __begin2;
  vector<lf::io::GMshFileV4::PeriodicLink,_std::allocator<lf::io::GMshFileV4::PeriodicLink>_>
  *__range2;
  allocator<char> local_629;
  string local_628;
  allocator<char> local_601;
  string local_600;
  stringstream local_5e0 [8];
  stringstream ss_2;
  ostream local_5d0 [376];
  string *local_458;
  char *local_450;
  string *local_448;
  char *local_440;
  bool local_432;
  undefined1 local_431;
  undefined1 local_430 [6];
  bool succesful;
  allocator<char> local_409;
  string local_408;
  allocator<char> local_3e1;
  string local_3e0;
  stringstream local_3c0 [8];
  stringstream ss_1;
  ostream local_3b0 [376];
  string local_238;
  allocator<char> local_211;
  string local_210;
  allocator<char> local_1e9;
  string local_1e8;
  stringstream local_1b8 [8];
  stringstream ss;
  ostream local_1a8 [376];
  int local_30;
  byte local_29;
  int size_t_size_local;
  bool is_binary_local;
  string *version_local;
  const_iterator end_local;
  const_iterator begin_local;
  GMshFileV4 *result;
  
  local_30 = size_t_size;
  local_29 = is_binary;
  _size_t_size_local = version;
  version_local = (string *)end._M_current;
  end_local = begin;
  bVar1 = std::operator==(version,"4.1");
  if (!bVar1) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::operator<<(local_1a8,"Only version 4.1 is supported so far");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e8,"version == \"4.1\"",&local_1e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_210,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/gmsh_file_v4.cc"
               ,&local_211);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1e8,&local_210,0x135,&local_238);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_210);
    std::allocator<char>::~allocator(&local_211);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::allocator<char>::~allocator(&local_1e9);
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"this code should not be reached");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_30 != 8) {
    std::__cxx11::stringstream::stringstream(local_3c0);
    poVar3 = std::operator<<(local_3b0,"size of size_t must be ");
    std::ostream::operator<<(poVar3,8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3e0,"size_t_size == sizeof(std::size_t)",&local_3e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_408,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/gmsh_file_v4.cc"
               ,&local_409);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_3e0,&local_408,0x137,(string *)local_430);
    std::__cxx11::string::~string((string *)local_430);
    std::__cxx11::string::~string((string *)&local_408);
    std::allocator<char>::~allocator(&local_409);
    std::__cxx11::string::~string((string *)&local_3e0);
    std::allocator<char>::~allocator(&local_3e1);
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"this code should not be reached");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_431 = 0;
  GMshFileV4::GMshFileV4(__return_storage_ptr__);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&__return_storage_ptr__->version_number,_size_t_size_local);
  __return_storage_ptr__->is_binary = (bool)(local_29 & 1);
  __return_storage_ptr__->size_t_size = local_30;
  local_432 = false;
  if ((local_29 & 1) == 0) {
    local_440 = end_local._M_current;
    local_448 = version_local;
    local_432 = detail::ParseGmshFileV4Text
                          (end_local,(const_iterator)version_local,__return_storage_ptr__);
  }
  else {
    local_450 = end_local._M_current;
    local_458 = version_local;
    local_432 = detail::ParseGmshFileV4Binary
                          (end_local,(const_iterator)version_local,one,__return_storage_ptr__);
  }
  if (local_432 == false) {
    std::__cxx11::stringstream::stringstream(local_5e0);
    poVar3 = std::operator<<(local_5d0,"Could not parse file ");
    std::operator<<(poVar3,(string *)filename);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_600,"succesful",&local_601);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_628,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/gmsh_file_v4.cc"
               ,&local_629);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_600,&local_628,0x145,(string *)&__range2);
    std::__cxx11::string::~string((string *)&__range2);
    std::__cxx11::string::~string((string *)&local_628);
    std::allocator<char>::~allocator(&local_629);
    std::__cxx11::string::~string((string *)&local_600);
    std::allocator<char>::~allocator(&local_601);
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"this code should not be reached");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  __end2 = std::
           vector<lf::io::GMshFileV4::PeriodicLink,_std::allocator<lf::io::GMshFileV4::PeriodicLink>_>
           ::begin(&__return_storage_ptr__->periodic_links);
  p = (PeriodicLink *)
      std::
      vector<lf::io::GMshFileV4::PeriodicLink,_std::allocator<lf::io::GMshFileV4::PeriodicLink>_>::
      end(&__return_storage_ptr__->periodic_links);
  while (bVar1 = __gnu_cxx::
                 operator==<lf::io::GMshFileV4::PeriodicLink_*,_std::vector<lf::io::GMshFileV4::PeriodicLink,_std::allocator<lf::io::GMshFileV4::PeriodicLink>_>_>
                           (&__end2,(__normal_iterator<lf::io::GMshFileV4::PeriodicLink_*,_std::vector<lf::io::GMshFileV4::PeriodicLink,_std::allocator<lf::io::GMshFileV4::PeriodicLink>_>_>
                                     *)&p), ((bVar1 ^ 0xffU) & 1) != 0) {
    pPVar4 = __gnu_cxx::
             __normal_iterator<lf::io::GMshFileV4::PeriodicLink_*,_std::vector<lf::io::GMshFileV4::PeriodicLink,_std::allocator<lf::io::GMshFileV4::PeriodicLink>_>_>
             ::operator*(&__end2);
    bVar1 = std::optional::operator_cast_to_bool((optional *)&pPVar4->affine_transform);
    if (bVar1) {
      this = (DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
             std::optional<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator->
                       (&pPVar4->affine_transform);
      Eigen::DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::transposeInPlace(this);
    }
    __gnu_cxx::
    __normal_iterator<lf::io::GMshFileV4::PeriodicLink_*,_std::vector<lf::io::GMshFileV4::PeriodicLink,_std::allocator<lf::io::GMshFileV4::PeriodicLink>_>_>
    ::operator++(&__end2);
  }
  return __return_storage_ptr__;
}

Assistant:

GMshFileV4 ReadGmshFileV4(std::string::const_iterator begin,
                          std::string::const_iterator end,
                          const std::string& version, bool is_binary,
                          int size_t_size, int one,
                          const std::string& filename) {
  LF_VERIFY_MSG(version == "4.1", "Only version 4.1 is supported so far");
  LF_VERIFY_MSG(size_t_size == sizeof(std::size_t),
                "size of size_t must be " << sizeof(std::size_t));

  GMshFileV4 result;
  result.version_number = version;
  result.is_binary = is_binary;
  result.size_t_size = size_t_size;

  bool succesful = false;
  if (!is_binary) {
    succesful = detail::ParseGmshFileV4Text(begin, end, &result);
  } else {
    succesful = detail::ParseGmshFileV4Binary(begin, end, one, &result);
  }

  LF_VERIFY_MSG(succesful, "Could not parse file " << filename);
  // LF_VERIFY_MSG(iter == end, "Could not parse all of file " << filename);

  // transpose all periodic matrices because they are read in column-first mode
  // but gmsh writes them in row-first mode
  for (auto& p : result.periodic_links) {
    if (p.affine_transform) {
      p.affine_transform->transposeInPlace();
    }
  }

  return result;
}